

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O3

void Abc_SuppRemove(Vec_Wrd_t *p,int *pCounts,Vec_Wec_t *pS,Vec_Wec_t *pD,int iVar,int nVars)

{
  ulong uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  if ((iVar < 0) || (pS->nSize <= iVar)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0xd3,"int Vec_WecLevelSize(Vec_Wec_t *, int)");
  }
  if (pS->pArray[(uint)iVar].nSize != 0) {
    __assert_fail("Vec_WecLevelSize(pS, iVar) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilSupp.c"
                  ,0x1a2,
                  "void Abc_SuppRemove(Vec_Wrd_t *, int *, Vec_Wec_t *, Vec_Wec_t *, int, int)");
  }
  if (iVar < pD->nSize) {
    pD->pArray[(uint)iVar].nSize = 0;
    if (0 < p->nSize) {
      uVar6 = 0;
      do {
        uVar1 = p->pArray[uVar6];
        if ((1L << ((byte)iVar & 0x3f) & uVar1) != 0) {
          iVar4 = pCounts[uVar6];
          pCounts[uVar6] = iVar4 + -1;
          if (iVar4 == 2) {
            if (0 < nVars) {
              uVar5 = 0;
              do {
                if ((uVar1 >> (uVar5 & 0x3f) & 1) != 0) {
                  if ((long)pD->nSize <= (long)uVar5) goto LAB_0049c431;
                  pVVar2 = pD->pArray;
                  iVar4 = pVVar2[uVar5].nSize;
                  if (0 < (long)iVar4) {
                    piVar3 = pVVar2[uVar5].pArray;
                    lVar7 = 1;
LAB_0049c3b9:
                    if (uVar6 != (uint)piVar3[lVar7 + -1]) goto code_r0x0049c3c3;
                    if ((int)lVar7 < iVar4) {
                      do {
                        piVar3[lVar7 + -1] = piVar3[lVar7];
                        lVar7 = lVar7 + 1;
                        iVar4 = pVVar2[uVar5].nSize;
                      } while ((int)lVar7 < iVar4);
                    }
                    pVVar2[uVar5].nSize = iVar4 + -1;
                    goto LAB_0049c3f5;
                  }
                  if (iVar4 != 0) {
                    __assert_fail("i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                  ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
                  }
LAB_0049c3f5:
                  Vec_WecPush(pS,(int)uVar5,(int)uVar6);
                }
                uVar5 = uVar5 + 1;
              } while (uVar5 != (uint)nVars);
            }
          }
          else if ((iVar4 == 3) && (0 < nVars)) {
            uVar5 = 0;
            do {
              if ((uVar1 >> (uVar5 & 0x3f) & 1) != 0) {
                Vec_WecPush(pD,(int)uVar5,(int)uVar6);
              }
              uVar5 = uVar5 + 1;
            } while ((uint)nVars != uVar5);
          }
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)p->nSize);
    }
    return;
  }
LAB_0049c431:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
code_r0x0049c3c3:
  bVar8 = lVar7 == iVar4;
  lVar7 = lVar7 + 1;
  if (bVar8) goto LAB_0049c3f5;
  goto LAB_0049c3b9;
}

Assistant:

void Abc_SuppRemove( Vec_Wrd_t * p, int * pCounts, Vec_Wec_t * pS, Vec_Wec_t * pD, int iVar, int nVars )
{
    word Entry; int i, v;
    assert( Vec_WecLevelSize(pS, iVar) == 0 );
    Vec_IntClear( Vec_WecEntry(pD, iVar) );
    Vec_WrdForEachEntry( p, Entry, i )
    {
        if ( ((Entry >> iVar) & 1) == 0 )
            continue;
        pCounts[i]--;
        if ( pCounts[i] == 1 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                {
                    Vec_IntRemove( Vec_WecEntry(pD, v), i );
                    Vec_WecPush( pS, v, i );
                }
        }
        else if ( pCounts[i] == 2 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                    Vec_WecPush( pD, v, i );
        }        
    }
}